

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O1

void push_complete_tx_timestamp(pending_tx_timestamps *tx_timestamps,timespec *to_add)

{
  uint uVar1;
  timestamp_info *ptVar2;
  __syscall_slong_t _Var3;
  uint uVar4;
  
  ptVar2 = tx_timestamps->pending;
  uVar1 = tx_timestamps->tail;
  uVar4 = get_max_pending_reqs();
  ptVar2 = ptVar2 + (ulong)uVar1 % (ulong)uVar4;
  _Var3 = to_add->tv_nsec;
  (ptVar2->time).tv_sec = to_add->tv_sec;
  (ptVar2->time).tv_nsec = _Var3;
  tx_timestamps->head = tx_timestamps->head + 1;
  tx_timestamps->tail = tx_timestamps->tail + 1;
  add_tx_timestamp(&ptVar2->time);
  return;
}

Assistant:

void push_complete_tx_timestamp(struct pending_tx_timestamps *tx_timestamps,
								struct timespec *to_add)
{
	struct timestamp_info *ts_info;

	ts_info =
		&tx_timestamps->pending[tx_timestamps->tail % get_max_pending_reqs()];
	ts_info->time = *to_add;
	// this is confusing but the consumed is used when receiving the reply
	tx_timestamps->head++;
	tx_timestamps->tail++;
	add_tx_timestamp(&ts_info->time);
}